

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_loo_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  quad *pqVar2;
  longdouble *plVar3;
  long lVar4;
  long lVar5;
  longdouble lVar6;
  long local_28;
  ushort uStack_20;
  
  plVar3 = std::__max_element<long_double*,__gnu_cxx::__ops::_Iter_less_iter>();
  lVar6 = *plVar3;
  lVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n] << 5;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 0x20) {
    lVar1 = *(longdouble *)
             ((long)&((this->quadratic_elements)._M_t.
                      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                      .
                      super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                     ._M_head_impl)->factor + lVar5);
    if (lVar1 <= lVar6 || lVar6 != lVar1) {
      lVar1 = lVar6;
    }
    lVar6 = lVar1;
  }
  local_28 = SUB108(lVar6,0);
  uStack_20 = (ushort)((unkuint10)lVar6 >> 0x40);
  if ((ushort)((uStack_20 & 0x7fff) - 1) < 0x7ffe && local_28 < 0) {
    plVar3 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    for (lVar5 = 0; (ulong)(uint)n << 4 != lVar5; lVar5 = lVar5 + 0x10) {
      *(longdouble *)((long)plVar3 + lVar5) = *(longdouble *)((long)plVar3 + lVar5) / lVar6;
    }
    pqVar2 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
             _M_head_impl;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 0x20) {
      *(longdouble *)((long)&pqVar2->factor + lVar5) =
           *(longdouble *)((long)&pqVar2->factor + lVar5) / lVar6;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }